

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegd_parser.c
# Opt level: O1

MPP_RET jpegd_parse(void *ctx,HalDecTask *task)

{
  undefined *puVar1;
  undefined *puVar2;
  MppBufSlots slots;
  MppFrame s;
  RK_U16 (*paRVar3) [64];
  RK_S32 RVar4;
  RK_S32 RVar5;
  RK_U32 *pRVar6;
  RK_U32 *pRVar7;
  MPP_RET MVar8;
  void *pvVar9;
  RK_U8 *pRVar10;
  size_t sVar11;
  RK_U32 *pRVar12;
  RK_U32 *extraout_RAX;
  ushort uVar13;
  AcTable *pAVar14;
  undefined8 uVar15;
  char *pcVar16;
  uint uVar17;
  JpegdSyntax *pJVar18;
  JpegdSyntax *pJVar19;
  int iVar20;
  uint uVar21;
  RK_U8 *pRVar22;
  long lVar23;
  BitReadCtx_t *pBVar24;
  MppFrameFormat v;
  DcTable *pDVar25;
  ulong uVar26;
  uint uVar27;
  JpegdSyntax *pJVar28;
  ulong uVar29;
  JpegdCtx *pJVar30;
  int iVar31;
  RK_U8 *pRVar32;
  JpegdSyntax *pJVar33;
  ulong uVar34;
  byte bVar35;
  undefined1 *puVar36;
  long lVar37;
  bool bVar38;
  RK_S32 _out;
  JpegdSyntax *local_d0;
  HalDecTask *local_c8;
  uint local_bc;
  JpegdCtx *local_b8;
  RK_U8 *local_b0;
  ulong local_a8;
  JpegdSyntax *local_a0;
  BitReadCtx_t *local_98;
  RK_U32 *local_90;
  JpegdSyntax *local_88;
  RK_U8 *local_80;
  undefined8 local_78;
  JpegdSyntax *local_70;
  AcTable *local_68;
  JpegdSyntax *local_60;
  RK_U8 *local_58;
  RK_U32 *local_50;
  RK_U32 *local_48;
  DcTable *local_40;
  undefined4 local_34;
  
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"jpegd_parser","enter\n","jpegd_parse");
  }
  task->valid = 0;
  pvVar9 = mpp_packet_get_data(*(MppPacket *)((long)ctx + 0x28));
  *(void **)((long)ctx + 0x50) = pvVar9;
  memset(*(void **)((long)ctx + 0x68),0,0x930);
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"jpegd_parser","enter\n","jpegd_decode_frame");
  }
  pRVar10 = *(RK_U8 **)((long)ctx + 0x50);
  uVar21 = *(uint *)((long)ctx + 0x20);
  local_98 = *(BitReadCtx_t **)((long)ctx + 0x60);
  pJVar18 = *(JpegdSyntax **)((long)ctx + 0x68);
  pJVar18->qtbl_entry = '\0';
  pJVar18->htbl_entry = '\0';
  if ((7 < (ulong)uVar21) && (pvVar9 = memchr(pRVar10,0xffd8,8), pvVar9 != (void *)0x0)) {
    pRVar22 = pRVar10 + uVar21;
    local_58 = pRVar22 + 1;
    local_d0 = pJVar18;
    local_c8 = task;
    local_b8 = (JpegdCtx *)ctx;
    local_b0 = pRVar22;
    local_80 = pRVar10;
LAB_001ba1e2:
    iVar20 = (int)local_58;
    iVar31 = (int)pRVar10;
    pRVar32 = pRVar10;
    do {
      if (pRVar22 <= pRVar32) {
LAB_001ba2b3:
        pJVar19 = (JpegdSyntax *)0x0;
        pRVar10 = pRVar32;
        break;
      }
      pRVar10 = (RK_U8 *)memchr(pRVar32,0xff,(ulong)(uint)(iVar20 - iVar31));
      if (pRVar10 == (RK_U8 *)0x0) {
        _mpp_log_l(2,"jpegd_parser","Start codec not found!\n",(char *)0x0);
        goto LAB_001ba2b3;
      }
      pJVar19 = (JpegdSyntax *)(ulong)pRVar10[1];
      bVar35 = pRVar10[1] + 1;
      if (bVar35 < 0xc1) {
        if ((jpegd_debug & 2) != 0) {
          _mpp_log_l(4,"jpegd_parser","0x%x is not a marker\n",(char *)0x0);
        }
        pRVar10 = pRVar32 + 1;
        pJVar19 = pJVar18;
      }
      else if ((jpegd_debug & 2) != 0) {
        _mpp_log_l(4,"jpegd_parser","find_marker skipped %d bytes\n",(char *)0x0);
      }
      pJVar18 = pJVar19;
      pRVar22 = local_b0;
      pRVar32 = pRVar10;
    } while (bVar35 < 0xc1);
    ctx = local_b8;
    bVar35 = (byte)pJVar19;
    if (bVar35 == 0) {
      local_98 = (BitReadCtx_t *)0xfffffc14;
      pJVar19 = local_d0;
      if ((jpegd_debug & 2) != 0) {
        _mpp_log_l(4,"jpegd_parser","start code not found\n",(char *)0x0);
        pJVar19 = local_d0;
      }
      goto LAB_001bb8dd;
    }
    uVar34 = (ulong)pJVar19 & 0xff;
    pRVar10 = pRVar10 + 2;
    iVar20 = (int)uVar34;
    if ((jpegd_debug & 2) != 0) {
      _mpp_log_l(4,"jpegd_parser","marker = 0x%x, avail_size_in_buf = %d\n",(char *)0x0,uVar34,
                 (long)pRVar22 - (long)pRVar10);
    }
    ((JpegdCtx *)ctx)->start_code = iVar20;
    mpp_set_bitread_ctx(local_98,pRVar10,(int)pRVar22 - (int)pRVar10);
    if (((bVar35 & 0xf8) == 0xd0) && ((jpegd_debug & 0x40) != 0)) {
      _mpp_log_l(4,"jpegd_parser","restart marker: %d\n",(char *)0x0);
    }
    pJVar19 = local_d0;
    pJVar18 = (JpegdSyntax *)(ulong)(byte)(bVar35 + 0x3f);
    if (iVar20 != 0xc4 && (byte)(bVar35 + 0x3f) < 0xf) {
      pcVar16 = "Only baseline DCT is supported, unsupported entropy encoding 0x%x";
LAB_001bb8c0:
      _mpp_log_l(2,"jpegd_parser",pcVar16,"jpegd_decode_frame",uVar34);
      task = local_c8;
      goto LAB_001bbd7a;
    }
    switch(iVar20) {
    case 0xd8:
      local_d0->qtbl_entry = '\0';
      local_d0->htbl_entry = '\0';
      local_d0->dht_found = '\0';
      local_d0->eoi_found = '\0';
      local_d0->sof0_found = '\0';
      local_d0->qtable_cnt = '\0';
      break;
    case 0xd9:
      local_d0->eoi_found = '\x01';
      if ((jpegd_debug & 2) == 0) {
        local_98 = (BitReadCtx_t *)0x0;
      }
      else {
        local_98 = (BitReadCtx_t *)0x0;
        _mpp_log_l(4,"jpegd_parser","still exists %d bytes behind EOI marker\n",(char *)0x0);
      }
      goto LAB_001bb8dd;
    case 0xda:
      if (local_d0->sof0_found == '\0') {
        pcVar16 = "Warning: only support baseline type\n";
      }
      else {
        pBVar24 = ((JpegdCtx *)ctx)->bit_ctx;
        local_a0 = ((JpegdCtx *)ctx)->syntax;
        MVar8 = mpp_read_bits(pBVar24,8,&_out);
        pBVar24->ret = MVar8;
        uVar34 = 0;
        if (MVar8 == MPP_OK) {
          local_a8 = CONCAT44(local_a8._4_4_,_out);
          MVar8 = mpp_read_bits(pBVar24,8,&_out);
          pBVar24->ret = MVar8;
          if (MVar8 == MPP_OK) {
            uVar34 = (ulong)(_out & 0xffU | ((uint)local_a8 & 0xff) << 8);
          }
        }
        pJVar18 = local_a0;
        uVar21 = (uint)uVar34;
        if (pBVar24->bytes_left_ < uVar21) {
          pcVar16 = "len %d is too large\n";
LAB_001ba617:
          _mpp_log_l(2,"jpegd_parser",pcVar16,"jpegd_decode_sos",uVar34);
LAB_001ba623:
          pJVar18 = local_d0;
          pRVar32 = local_80;
          iVar20 = -0x3ec;
        }
        else {
          local_a0->sos_len = uVar21;
          MVar8 = mpp_read_bits(pBVar24,8,&_out);
          pBVar24->ret = MVar8;
          if (MVar8 != MPP_OK) {
            local_a8 = CONCAT44(local_a8._4_4_,0xffffffff);
            goto LAB_001ba9f9;
          }
          if ((_out & 0xfffffffdU) != 1) {
            pcVar16 = "decode_sos: nb_components %d unsupported\n";
            uVar34 = (ulong)(uint)_out;
            goto LAB_001ba617;
          }
          if (_out * 2 + 6U != uVar21) {
            _mpp_log_l(2,"jpegd_parser","decode_sos: invalid len (%d), nb_components:%d\n",
                       "jpegd_decode_sos",uVar34);
            goto LAB_001ba623;
          }
          local_a8 = CONCAT44(local_a8._4_4_,0xffffffff);
          pJVar18->qtable_cnt = (RK_U8)_out;
          puVar36 = (undefined1 *)0x0;
          local_90 = (RK_U32 *)(ulong)(uint)_out;
          do {
            MVar8 = mpp_read_bits(pBVar24,8,&_out);
            pBVar24->ret = MVar8;
            if (MVar8 != MPP_OK) goto LAB_001ba9f9;
            uVar21 = _out - 1;
            if ((jpegd_debug & 2) != 0) {
              _mpp_log_l(4,"jpegd_parser","sos component: %d\n",(char *)0x0);
            }
            uVar29 = (ulong)pJVar18->nb_components;
            uVar26 = 0;
            uVar34 = uVar26;
            if (uVar29 != 0) {
              do {
                uVar34 = uVar26;
                if (uVar21 == pJVar18->component_id[uVar26]) break;
                uVar26 = uVar26 + 1;
                uVar34 = uVar29;
              } while (uVar29 != uVar26);
            }
            if ((uint)uVar34 == pJVar18->nb_components) {
              _mpp_log_l(2,"jpegd_parser","decode_sos: index(%d) out of components\n",
                         "jpegd_decode_sos");
              ctx = local_b8;
              goto LAB_001ba623;
            }
            MVar8 = mpp_read_bits(pBVar24,4,&_out);
            uVar17 = _out;
            pBVar24->ret = MVar8;
            if (MVar8 != MPP_OK) {
              bVar38 = false;
              ctx = local_b8;
              goto LAB_001ba9fb;
            }
            local_a0->dc_index[(long)puVar36] = _out;
            MVar8 = mpp_read_bits(pBVar24,4,&_out);
            pJVar18 = local_a0;
            pBVar24->ret = MVar8;
            bVar38 = false;
            if (MVar8 == MPP_OK) {
              uVar17 = _out;
            }
            pRVar22 = local_b0;
            ctx = local_b8;
            if (MVar8 != MPP_OK) goto LAB_001ba9fb;
            local_a0->ac_index[(long)puVar36] = uVar17;
            if ((jpegd_debug & 2) != 0) {
              _mpp_log_l(4,"jpegd_parser","component:%d, dc_index:%d, ac_index:%d\n",(char *)0x0,
                         (ulong)uVar21,(ulong)local_a0->dc_index[(long)puVar36],(ulong)uVar17);
            }
            pRVar22 = local_b0;
            ctx = local_b8;
            if ((1 < pJVar18->dc_index[(long)puVar36]) || (1 < pJVar18->ac_index[(long)puVar36])) {
              _mpp_log_l(2,"jpegd_parser","Huffman table id error\n","jpegd_decode_sos");
              pRVar22 = local_b0;
              ctx = local_b8;
              goto LAB_001ba623;
            }
            puVar36 = puVar36 + 1;
          } while ((RK_U32 *)puVar36 != local_90);
          MVar8 = mpp_read_bits(pBVar24,8,&_out);
          pJVar18 = local_a0;
          pBVar24->ret = MVar8;
          if (MVar8 == MPP_OK) {
            local_a0->scan_start = (RK_U8)_out;
            MVar8 = mpp_read_bits(pBVar24,8,&_out);
            pBVar24->ret = MVar8;
            if (MVar8 != MPP_OK) goto LAB_001ba9f9;
            pJVar18->scan_end = (RK_U8)_out;
            MVar8 = mpp_read_bits(pBVar24,4,&_out);
            pBVar24->ret = MVar8;
            if (MVar8 != MPP_OK) goto LAB_001ba9f9;
            pJVar18->prev_shift = (RK_U8)_out;
            MVar8 = mpp_read_bits(pBVar24,4,&_out);
            pBVar24->ret = MVar8;
            bVar38 = false;
            pRVar22 = local_b0;
            ctx = local_b8;
            if (MVar8 == MPP_OK) {
              local_a0->point_transform = (RK_U8)_out;
              if ((((local_a0->scan_start != 0) || (local_a0->scan_end != '?')) ||
                  (local_a0->prev_shift != '\0')) || ((_out & 0xffU) != 0)) {
                _mpp_log_l(2,"jpegd_parser",
                           "unsupported sos parameter: scan_start:%d,\n\t\tscan_end:%d, prev_shift:%d, point_transform:%d\n"
                           ,"jpegd_decode_sos",(ulong)local_a0->scan_start,(ulong)local_a0->scan_end
                           ,(ulong)local_a0->prev_shift,(ulong)(_out & 0xff));
                pRVar22 = local_b0;
                ctx = local_b8;
                goto LAB_001ba623;
              }
              local_a8 = local_a8 & 0xffffffff00000000;
              bVar38 = true;
            }
          }
          else {
LAB_001ba9f9:
            bVar38 = false;
          }
LAB_001ba9fb:
          pRVar32 = local_80;
          pJVar18 = local_d0;
          if ((!bVar38) && ((jpegd_debug & 0x40) != 0)) {
            _mpp_log_l(4,"jpegd_parser","bit read error!\n",(char *)0x0);
          }
          iVar20 = (uint)local_a8;
        }
        if (iVar20 == 0) {
          uVar21 = ((int)pRVar10 - (int)pRVar32) + pJVar18->sos_len;
          pJVar18->strm_offset = uVar21;
          pJVar18->cur_pos = pRVar32 + uVar21;
          pJVar18->pkt_len = ((JpegdCtx *)ctx)->streamLength;
          if ((jpegd_debug & 2) != 0) {
            sVar11 = mpp_packet_get_size(((JpegdCtx *)ctx)->input_packet);
            _mpp_log_l(4,"jpegd_parser",
                       "This packet owns %d bytes with length %zu\n\t\thas been decoded %d bytes by software\n\t\tbuf_ptr:%p, buf:%p, sos_len:%d\n\t\thardware start address:%p"
                       ,(char *)0x0,sVar11,(ulong)pJVar18->pkt_len,(ulong)pJVar18->strm_offset,
                       pRVar10,pRVar32,(ulong)pJVar18->sos_len,pJVar18->cur_pos);
          }
          if (((JpegdCtx *)ctx)->streamLength <= pJVar18->strm_offset) {
            _mpp_log_l(2,"jpegd_parser","stream offset %d is larger than buffer size %d\n",
                       "jpegd_decode_frame");
            task = local_c8;
            goto LAB_001bbd7a;
          }
          if (((pJVar18->strm_offset + 2 < ((JpegdCtx *)ctx)->streamLength) &&
              (pRVar10[pJVar18->sos_len] == 0xff)) && (pRVar10[pJVar18->sos_len + 1] == 0xd8)) {
            if ((jpegd_debug & 2) != 0) {
              _mpp_log_l(4,"jpegd_parser","Encontered SOI again, parse again!\n",(char *)0x0);
            }
            break;
          }
          if (((JpegdCtx *)ctx)->scan_all_marker == 0) {
            if ((jpegd_debug & 2) == 0) {
              local_98 = (BitReadCtx_t *)0x0;
              pJVar19 = local_d0;
              ctx = local_b8;
            }
            else {
              local_98 = (BitReadCtx_t *)0x0;
              _mpp_log_l(4,"jpegd_parser","just scan parts of markers!\n",(char *)0x0);
              pJVar19 = local_d0;
              ctx = local_b8;
            }
            goto LAB_001bb8dd;
          }
          break;
        }
        pcVar16 = "sos decode error\n";
      }
      _mpp_log_l(2,"jpegd_parser",pcVar16,"jpegd_decode_frame");
      task = local_c8;
      goto LAB_001bbd7a;
    case 0xdb:
      pBVar24 = ((JpegdCtx *)ctx)->bit_ctx;
      pJVar18 = ((JpegdCtx *)ctx)->syntax;
      MVar8 = mpp_read_bits(pBVar24,8,&_out);
      RVar4 = _out;
      pBVar24->ret = MVar8;
      uVar21 = 0xfffffffe;
      if (MVar8 == MPP_OK) {
        MVar8 = mpp_read_bits(pBVar24,8,&_out);
        pBVar24->ret = MVar8;
        if (MVar8 == MPP_OK) {
          uVar21 = ((RVar4 & 0xffU) * 0x100 + (_out & 0xffU)) - 2;
        }
      }
      if (pBVar24->bytes_left_ < uVar21) {
        _mpp_log_l(2,"jpegd_parser","dqt: len %d is too large\n","jpegd_decode_dqt");
LAB_001baec2:
        pJVar18 = (JpegdSyntax *)0xfffffc14;
      }
      else {
        do {
          local_88 = pJVar18;
          uVar17 = uVar21;
          if (uVar17 < 0x41) {
            pJVar18 = (JpegdSyntax *)0x0;
            goto LAB_001bb4ae;
          }
          MVar8 = mpp_read_bits(pBVar24,4,&_out);
          RVar4 = _out;
          pBVar24->ret = MVar8;
          iVar20 = 6;
          uVar21 = uVar17;
          if (MVar8 == MPP_OK) {
            uVar13 = (ushort)_out;
            if ((ushort)_out < 2) {
              MVar8 = mpp_read_bits(pBVar24,4,&_out);
              RVar5 = _out;
              pBVar24->ret = MVar8;
              if (MVar8 == MPP_OK) {
                uVar27 = _out;
                if (3 < _out) {
                  pcVar16 = "dqt: invalid quantize tables ID\n";
                  goto LAB_001ba71e;
                }
                if ((jpegd_debug & 2) != 0) {
                  _mpp_log_l(4,"jpegd_parser","quantize tables ID=%d\n",(char *)0x0);
                }
                local_78 = (RK_U32 *)(CONCAT44(local_78._4_4_,RVar4) & 0xffffffff0000ffff);
                local_60 = (JpegdSyntax *)(long)RVar5;
                pAVar14 = (AcTable *)((long)local_60 * 0x80);
                paRVar3 = local_88->quant_matrixes;
                lVar23 = 0;
                local_bc = uVar27;
                local_68 = pAVar14;
                do {
                  MVar8 = mpp_read_bits(pBVar24,(uint)(uVar13 != 0) * 8 + 8,&_out);
                  pBVar24->ret = MVar8;
                  if (MVar8 != MPP_OK) {
                    iVar20 = 6;
                    pRVar22 = local_b0;
                    goto LAB_001ba75b;
                  }
                  local_a0 = (JpegdSyntax *)CONCAT62(local_a0._2_6_,(ushort)_out);
                  *(ushort *)((long)pAVar14->bits + (long)(*paRVar3 + lVar23)) = (ushort)_out;
                  lVar23 = lVar23 + 1;
                } while (lVar23 != 0x40);
                bVar35 = local_88->qtbl_entry + 1;
                local_88->qtbl_entry = bVar35;
                if (3 < bVar35) {
                  _mpp_log_l(2,"jpegd_parser","%d entries qtbl is not supported\n",
                             "jpegd_decode_dqt");
                }
                if ((jpegd_debug & 4) != 0) {
                  _mpp_log_l(4,"jpegd_parser","******Start to print quantize table %d******\n",
                             (char *)0x0,(ulong)local_bc);
                  uVar34 = 0;
                  do {
                    local_a8 = (ulong)*(ushort *)((long)pAVar14->bits + (long)(*paRVar3 + uVar34));
                    local_90 = (RK_U32 *)
                               (ulong)*(ushort *)
                                       ((long)pAVar14->bits + (long)(*paRVar3 + uVar34 + 1));
                    local_70 = (JpegdSyntax *)
                               (ulong)*(ushort *)
                                       ((long)pAVar14->bits + (long)(*paRVar3 + uVar34 + 2));
                    uVar29 = (ulong)*(ushort *)((long)pAVar14->bits + (long)(*paRVar3 + uVar34 + 7))
                    ;
                    _mpp_log_l(4,"jpegd_parser",
                               "%2d~%2d 0x%02x, 0x%02x, 0x%02x, 0x%02x, 0x%02x, 0x%02x, 0x%02x, 0x%02x\n"
                               ,(char *)0x0,uVar34 & 0xffffffff,(ulong)((int)uVar34 + 7),local_a8,
                               local_90,local_70,
                               (ulong)*(ushort *)
                                       ((long)pAVar14->bits + (long)(*paRVar3 + uVar34 + 3)),
                               (ulong)*(ushort *)
                                       ((long)pAVar14->bits + (long)(*paRVar3 + uVar34 + 4)),
                               (ulong)*(ushort *)
                                       ((long)pAVar14->bits + (long)(*paRVar3 + uVar34 + 5)),uVar29,
                               uVar29);
                    bVar38 = uVar34 < 0x38;
                    uVar34 = uVar34 + 8;
                  } while (bVar38);
                  _mpp_log_l(4,"jpegd_parser","******Quantize table %d End******\n",(char *)0x0);
                }
                pRVar22 = local_b0;
                uVar13 = *(ushort *)((long)(local_88->quant_matrixes[0] + 1) + (long)local_68);
                uVar21 = *(uint *)((long)(local_88->quant_matrixes[0] + 8) + (long)local_68);
                if ((ushort)uVar21 < uVar13) {
                  uVar21 = (uint)uVar13;
                }
                local_88->qscale[(long)local_60] = (RK_U32)(((ulong)uVar21 & 0xffff) >> 1);
                iVar31 = (int)local_78;
                if ((jpegd_debug & 2) != 0) {
                  _mpp_log_l(4,"jpegd_parser","qscale[%d]: %d\n",(char *)0x0);
                }
                iVar20 = 0;
                uVar21 = uVar17 - (iVar31 * 0x40 + 0x41U & 0xffff);
              }
              else {
                iVar20 = 6;
              }
            }
            else {
              pcVar16 = "dqt: invalid precision\n";
LAB_001ba71e:
              _mpp_log_l(2,"jpegd_parser",pcVar16,"jpegd_decode_dqt");
              iVar20 = 1;
            }
          }
LAB_001ba75b:
          pJVar18 = local_88;
        } while (iVar20 == 0);
        pJVar18 = (JpegdSyntax *)0xffffffff;
        if (iVar20 != 6) goto LAB_001baec2;
LAB_001bb4ae:
        if ((0x40 < uVar17) && ((jpegd_debug & 0x40) != 0)) {
          _mpp_log_l(4,"jpegd_parser","bit read error!\n",(char *)0x0);
        }
      }
      if ((int)pJVar18 != 0) {
        pcVar16 = "quantize tables decode error\n";
LAB_001bbc43:
        _mpp_log_l(2,"jpegd_parser",pcVar16,"jpegd_decode_frame");
        ctx = local_b8;
        task = local_c8;
        goto LAB_001bbd7a;
      }
      break;
    case 0xdc:
switchD_001ba383_caseD_dc:
      if ((jpegd_debug & 2) != 0) {
        _mpp_log_l(4,"jpegd_parser","unhandled coding type(0x%x) in switch..case..\n",(char *)0x0);
      }
      pBVar24 = ((JpegdCtx *)ctx)->bit_ctx;
      if (1 < pBVar24->bytes_left_) {
        MVar8 = mpp_read_bits(pBVar24,8,&_out);
        pBVar24->ret = MVar8;
        uVar17 = _out << 8;
        uVar21 = 0;
        if (MVar8 == MPP_OK) {
          MVar8 = mpp_read_bits(pBVar24,8,&_out);
          pBVar24->ret = MVar8;
          if (MVar8 == MPP_OK) {
            uVar21 = _out & 0xffU | uVar17;
          }
          else {
            uVar21 = 0;
          }
        }
        pJVar18 = (JpegdSyntax *)0x0;
        if ((1 < (ushort)uVar21) && (uVar17 = (uVar21 & 0xffff) - 2, uVar17 <= pBVar24->bytes_left_)
           ) {
          if ((ushort)uVar21 != 2) {
            MVar8 = mpp_skip_longbits(pBVar24,uVar17 * 8);
            pBVar24->ret = MVar8;
            if (MVar8 != MPP_OK) goto LAB_001bbb06;
          }
          break;
        }
      }
LAB_001bbb06:
      ctx = local_b8;
      task = local_c8;
      if ((jpegd_debug & 2) != 0) {
        _mpp_log_l(4,"jpegd_parser","Fail to skip section 0xFF%02x!\n",(char *)0x0,uVar34);
      }
      goto LAB_001bbd7a;
    case 0xdd:
      pBVar24 = ((JpegdCtx *)ctx)->bit_ctx;
      pJVar18 = ((JpegdCtx *)ctx)->syntax;
      MVar8 = mpp_read_bits(pBVar24,8,&_out);
      pBVar24->ret = MVar8;
      iVar20 = _out << 8;
      uVar13 = 0;
      if (MVar8 == MPP_OK) {
        MVar8 = mpp_read_bits(pBVar24,8,&_out);
        pBVar24->ret = MVar8;
        if (MVar8 == MPP_OK) {
          uVar13 = (ushort)_out & 0xff | (ushort)iVar20;
        }
        else {
          uVar13 = 0;
        }
      }
      if (uVar13 == 4) {
        MVar8 = mpp_read_bits(pBVar24,0x10,&_out);
        pRVar22 = local_b0;
        pBVar24->ret = MVar8;
        if (MVar8 == MPP_OK) {
          pJVar18->restart_interval = _out;
          pJVar18 = (JpegdSyntax *)0x0;
          if ((jpegd_debug & 2) != 0) {
            pJVar18 = (JpegdSyntax *)0x0;
            _mpp_log_l(4,"jpegd_parser","restart interval: %d\n",(char *)0x0);
          }
        }
        else {
          pJVar18 = (JpegdSyntax *)0xffffffff;
        }
        if ((MVar8 != MPP_OK) && ((jpegd_debug & 0x40) != 0)) {
          _mpp_log_l(4,"jpegd_parser","bit read error!\n",(char *)0x0);
        }
      }
      else {
        _mpp_log_l(2,"jpegd_parser","DRI length %d error\n","jpegd_decode_dri");
        pJVar18 = (JpegdSyntax *)0xfffffc14;
        pRVar22 = local_b0;
      }
      if ((int)pJVar18 != 0) {
        pcVar16 = "dri decode error\n";
        goto LAB_001bbc43;
      }
      break;
    default:
      if (iVar20 == 0xc0) {
        pBVar24 = ((JpegdCtx *)ctx)->bit_ctx;
        pJVar18 = ((JpegdCtx *)ctx)->syntax;
        MVar8 = mpp_read_bits(pBVar24,8,&_out);
        RVar4 = _out;
        pBVar24->ret = MVar8;
        uVar21 = 0;
        if (MVar8 == MPP_OK) {
          MVar8 = mpp_read_bits(pBVar24,8,&_out);
          pBVar24->ret = MVar8;
          uVar21 = 0;
          if (MVar8 == MPP_OK) {
            uVar21 = _out & 0xffU | (RVar4 & 0xffU) << 8;
          }
        }
        pRVar22 = local_b0;
        task = local_c8;
        if (pBVar24->bytes_left_ < uVar21) {
          _mpp_log_l(2,"jpegd_parser","len %d is too large\n","jpegd_decode_sof",(ulong)uVar21);
        }
        else {
          MVar8 = mpp_read_bits(pBVar24,8,&_out);
          pBVar24->ret = MVar8;
          if (MVar8 == MPP_OK) {
            uVar34 = (ulong)(uint)_out;
            if (_out - 0x11U < 0xfffffff0) {
              pcVar16 = "bits %d is invalid\n";
LAB_001bbd48:
              _mpp_log_l(2,"jpegd_parser",pcVar16,"jpegd_decode_sof",uVar34);
              task = local_c8;
              goto LAB_001bbd54;
            }
            pJVar18->sample_precision = (RK_U8)_out;
            MVar8 = mpp_read_bits(pBVar24,0x10,&_out);
            RVar4 = _out;
            pBVar24->ret = MVar8;
            if (MVar8 == MPP_OK) {
              MVar8 = mpp_read_bits(pBVar24,0x10,&_out);
              pBVar24->ret = MVar8;
              if (MVar8 == MPP_OK) {
                pJVar18->height = RVar4;
                pJVar18->width = _out;
                uVar17 = _out + 0xfU & 0xfffffff0;
                pJVar18->hor_stride = uVar17;
                uVar27 = RVar4 + 0xfU & 0xfffffff0;
                pJVar18->ver_stride = uVar27;
                if ((jpegd_debug & 2) != 0) {
                  _mpp_log_l(4,"jpegd_parser","sof0: picture: %dx%d, stride: %dx%d\n",(char *)0x0,
                             (ulong)(uint)_out,(ulong)(uint)RVar4,(ulong)uVar17,(ulong)uVar27);
                }
                MVar8 = mpp_read_bits(pBVar24,8,&_out);
                RVar4 = _out;
                pBVar24->ret = MVar8;
                if (MVar8 == MPP_OK) {
                  if ((_out & 0xfffffffdU) != 1) {
                    pcVar16 = "components number %d error\n";
                    uVar34 = (ulong)(uint)_out;
                    goto LAB_001bbd48;
                  }
                  if (_out * 3 + 8U != uVar21) {
                    _mpp_log_l(2,"jpegd_parser",
                               "decode_sof0: error, len(%d) mismatch nb_components(%d)\n",
                               "jpegd_decode_sof",(ulong)uVar21,(ulong)(uint)_out);
                  }
                  pJVar18->nb_components = RVar4;
                  pJVar18->h_max = 1;
                  pJVar18->v_max = 1;
                  uVar29 = 0;
                  do {
                    MVar8 = mpp_read_bits(pBVar24,8,&_out);
                    pBVar24->ret = MVar8;
                    if (MVar8 != MPP_OK) goto LAB_001bb834;
                    pJVar18->component_id[uVar29] = _out - 1;
                    MVar8 = mpp_read_bits(pBVar24,4,&_out);
                    uVar21 = _out;
                    pBVar24->ret = MVar8;
                    if (MVar8 != MPP_OK) goto LAB_001bb834;
                    pJVar18->h_count[uVar29] = _out;
                    MVar8 = mpp_read_bits(pBVar24,4,&_out);
                    pBVar24->ret = MVar8;
                    if (MVar8 == MPP_OK) {
                      uVar21 = _out;
                    }
                    if (MVar8 != MPP_OK) goto LAB_001bb834;
                    pJVar18->v_count[uVar29] = uVar21;
                    uVar17 = pJVar18->h_count[uVar29];
                    if ((uVar17 == 0) || (uVar21 == 0)) {
                      _mpp_log_l(2,"jpegd_parser","Invalid sampling factor in component %d %d:%d\n",
                                 "jpegd_decode_sof",uVar29 & 0xffffffff,(ulong)uVar17,(ulong)uVar21)
                      ;
                      task = local_c8;
                      goto LAB_001bbd54;
                    }
                    if (pJVar18->h_max < uVar17) {
                      pJVar18->h_max = uVar17;
                    }
                    if (pJVar18->v_max < pJVar18->v_count[uVar29]) {
                      pJVar18->v_max = pJVar18->v_count[uVar29];
                    }
                    MVar8 = mpp_read_bits(pBVar24,8,&_out);
                    pBVar24->ret = MVar8;
                    if (MVar8 != MPP_OK) goto LAB_001bb834;
                    uVar34 = (ulong)(uint)_out;
                    pJVar18->quant_index[uVar29] = _out;
                    if (3 < (uint)_out) {
                      pcVar16 = "quant_index %d is invalid\n";
                      goto LAB_001bbd48;
                    }
                    if ((jpegd_debug & 2) != 0) {
                      _mpp_log_l(4,"jpegd_parser","component %d %d:%d id: %d quant_id:%d\n",
                                 (char *)0x0,uVar29 & 0xffffffff,(ulong)pJVar18->h_count[uVar29],
                                 (ulong)pJVar18->v_count[uVar29],
                                 (ulong)pJVar18->component_id[uVar29],uVar34);
                    }
                    uVar29 = uVar29 + 1;
                  } while ((uint)RVar4 != uVar29);
                  MVar8 = jpeg_judge_yuv_mode(local_b8);
                  if (MVar8 == MPP_OK) {
                    bVar35 = local_b8->syntax->sample_precision;
                    uVar34 = (ulong)bVar35;
                    if (bVar35 != 8) {
                      pcVar16 = 
                      "Illegal sample precision %d.\n                    For baseline, it should be 8\n"
                      ;
                      ctx = local_b8;
                      goto LAB_001bb8c0;
                    }
                    local_d0->sof0_found = '\x01';
                    break;
                  }
                }
              }
            }
          }
LAB_001bb834:
          task = local_c8;
          if ((jpegd_debug & 0x40) != 0) {
            _mpp_log_l(4,"jpegd_parser","bit read error!\n",(char *)0x0);
          }
        }
LAB_001bbd54:
        pcVar16 = "sof0 decode error\n";
      }
      else {
        if (iVar20 != 0xc4) goto switchD_001ba383_caseD_dc;
        pBVar24 = ((JpegdCtx *)ctx)->bit_ctx;
        pJVar19 = ((JpegdCtx *)ctx)->syntax;
        MVar8 = mpp_read_bits(pBVar24,8,&_out);
        RVar4 = _out;
        pBVar24->ret = MVar8;
        pJVar28 = (JpegdSyntax *)0xfffffffe;
        if (MVar8 == MPP_OK) {
          pJVar18 = (JpegdSyntax *)(ulong)(uint)_out;
          MVar8 = mpp_read_bits(pBVar24,8,&_out);
          pBVar24->ret = MVar8;
          if (MVar8 == MPP_OK) {
            pJVar18 = (JpegdSyntax *)0x0;
            pJVar28 = (JpegdSyntax *)(ulong)(((RVar4 & 0xffU) * 0x100 + (_out & 0xffU)) - 2);
          }
        }
        pJVar33 = local_d0;
        uVar21 = (uint)pJVar28;
        if (pBVar24->bytes_left_ < uVar21) {
          _mpp_log_l(2,"jpegd_parser","dht: len %d is too large\n","jpegd_decode_dht");
          task = local_c8;
          pJVar33 = local_d0;
          uVar21 = 0xfffffc14;
        }
        else {
          pRVar12 = &jpegd_debug;
          if ((jpegd_debug & 2) != 0) {
            _mpp_log_l(4,"jpegd_parser","dht: huffman tables length=%d\n",(char *)0x0);
            pRVar12 = extraout_RAX;
          }
          if (uVar21 == 0) {
            local_88 = (JpegdSyntax *)
                       CONCAT44(local_88._4_4_,
                                (int)CONCAT71((int7)((ulong)pRVar12 >> 8),uVar21 == 0));
          }
          else {
            local_68 = pJVar19->ac_table;
            local_40 = pJVar19->dc_table;
            local_48 = pJVar19->ac_table[0].vals;
            local_90 = pJVar19->dc_table[0].vals;
            uVar15 = 0;
            local_60 = pJVar19;
            local_50 = local_90;
            do {
              if ((uint)pJVar28 < 0x11) {
                pcVar16 = "dht: len %d is too small\n";
                goto LAB_001bb740;
              }
              local_88 = (JpegdSyntax *)CONCAT44(local_88._4_4_,(int)uVar15);
              MVar8 = mpp_read_bits(pBVar24,4,&_out);
              pBVar24->ret = MVar8;
              if (MVar8 != MPP_OK) {
                local_bc = 0xffffffff;
                goto LAB_001bb53e;
              }
              local_a8 = CONCAT44(local_a8._4_4_,_out);
              if (1 < (uint)_out) {
                pcVar16 = "table type %d error\n";
LAB_001bb740:
                _mpp_log_l(2,"jpegd_parser",pcVar16,"jpegd_decode_dht");
LAB_001bb747:
                task = local_c8;
                uVar21 = 0xfffffc14;
                goto LAB_001bb751;
              }
              local_bc = 0xffffffff;
              MVar8 = mpp_read_bits(pBVar24,4,&_out);
              pDVar25 = local_40;
              pAVar14 = local_68;
              pBVar24->ret = MVar8;
              if (MVar8 != MPP_OK) goto LAB_001bb53e;
              pRVar12 = (RK_U32 *)(ulong)(uint)_out;
              if (1 < (uint)_out) {
                pcVar16 = "table id %d is unsupported for baseline\n";
                goto LAB_001bb740;
              }
              local_90 = pRVar12;
              local_78 = pRVar12;
              if ((uint)local_a8 == 0) {
                lVar23 = 0;
                pJVar19 = (JpegdSyntax *)0x0;
                do {
                  MVar8 = mpp_read_bits(pBVar24,8,&_out);
                  pBVar24->ret = MVar8;
                  bVar38 = MVar8 == MPP_OK;
                  if (!bVar38) goto LAB_001bacea;
                  pDVar25[(long)pRVar12].bits[lVar23] = _out;
                  uVar21 = (int)pJVar19 + _out;
                  pJVar19 = (JpegdSyntax *)(ulong)uVar21;
                  lVar23 = lVar23 + 1;
                } while (lVar23 != 0x10);
                pDVar25[(long)pRVar12].actual_length = uVar21;
              }
              else {
                lVar23 = 0;
                pJVar19 = (JpegdSyntax *)0x0;
                do {
                  MVar8 = mpp_read_bits(pBVar24,8,&_out);
                  pBVar24->ret = MVar8;
                  bVar38 = MVar8 == MPP_OK;
                  if (!bVar38) goto LAB_001bacea;
                  pAVar14[(long)pRVar12].bits[lVar23] = _out;
                  uVar21 = (int)pJVar19 + _out;
                  pJVar19 = (JpegdSyntax *)(ulong)uVar21;
                  lVar23 = lVar23 + 1;
                } while (lVar23 != 0x10);
                pAVar14[(long)pRVar12].actual_length = uVar21;
              }
              bVar38 = true;
LAB_001bacea:
              pRVar7 = local_48;
              pRVar6 = local_50;
              pRVar12 = local_78;
              pRVar22 = local_b0;
              pJVar33 = local_d0;
              pJVar18 = pJVar28;
              if (!bVar38) goto LAB_001bb53e;
              uVar21 = (uint)pJVar28 - 0x11;
              uVar17 = (uint)pJVar19;
              pJVar18 = (JpegdSyntax *)(ulong)(uVar21 - uVar17);
              local_70 = pJVar18;
              if (((uVar21 < uVar17) || ((uint)local_a8 == 0 && 0xc < uVar17)) ||
                 ((0xa2 < uVar17 && ((uint)local_a8 == 1)))) {
                _mpp_log_l(2,"jpegd_parser","table type %d, code word number %d error\n",
                           "jpegd_decode_dht",local_a8 & 0xffffffff,pJVar19);
                goto LAB_001bb747;
              }
              uVar21 = (int)local_90 * 2;
              uVar34 = (ulong)uVar21;
              bVar35 = (byte)uVar21;
              if ((uint)local_a8 == 0) {
                local_60->htbl_entry = local_60->htbl_entry | (byte)(1 << (bVar35 & 0x1f));
                if (uVar17 == 0) goto LAB_001bae43;
                pJVar28 = (JpegdSyntax *)0x0;
                pJVar18 = (JpegdSyntax *)0x0;
                local_a0 = pJVar19;
                do {
                  MVar8 = mpp_read_bits(pBVar24,8,&_out);
                  pBVar24->ret = MVar8;
                  bVar38 = MVar8 == MPP_OK;
                  if (!bVar38) goto LAB_001bae51;
                  if ((uint)pJVar18 < (uint)_out) {
                    pJVar18 = (JpegdSyntax *)(ulong)(uint)_out;
                  }
                  pRVar6[(long)pJVar28->quant_matrixes[0] + (long)pRVar12 * 0x1d] = _out;
                  pJVar28 = (JpegdSyntax *)((long)pJVar28->quant_matrixes[0] + 1);
                } while (local_a0 != pJVar28);
LAB_001bae35:
                bVar38 = true;
              }
              else {
                local_60->htbl_entry = local_60->htbl_entry | (byte)(2 << (bVar35 & 0x1f));
                if (uVar17 != 0) {
                  pJVar28 = (JpegdSyntax *)0x0;
                  pJVar18 = (JpegdSyntax *)0x0;
                  local_a0 = pJVar19;
                  do {
                    MVar8 = mpp_read_bits(pBVar24,8,&_out);
                    pBVar24->ret = MVar8;
                    bVar38 = MVar8 == MPP_OK;
                    if (!bVar38) goto LAB_001bae51;
                    if ((uint)pJVar18 < (uint)_out) {
                      pJVar18 = (JpegdSyntax *)(ulong)(uint)_out;
                    }
                    pRVar7[(long)pJVar28->quant_matrixes + (long)pRVar12 * 0xb3] = _out;
                    pJVar28 = (JpegdSyntax *)((long)pJVar28->quant_matrixes[0] + 1);
                  } while (local_a0 != pJVar28);
                  goto LAB_001bae35;
                }
LAB_001bae43:
                bVar38 = true;
                pJVar18 = (JpegdSyntax *)0x0;
              }
LAB_001bae51:
              pRVar22 = local_b0;
              pJVar33 = local_d0;
              if (!bVar38) goto LAB_001bb53e;
              if ((jpegd_debug & 2) != 0) {
                uVar34 = 0;
                _mpp_log_l(4,"jpegd_parser",
                           "dht: type=%d id=%d code_word_num=%d, code_max=%d, len=%d\n",(char *)0x0,
                           local_a8 & 0xffffffff,local_90,pJVar19,pJVar18,local_70);
              }
              bVar38 = (int)local_70 == 0;
              uVar15 = CONCAT71((int7)(uVar34 >> 8),bVar38);
              pJVar28 = local_70;
            } while (!bVar38);
            local_88 = (JpegdSyntax *)CONCAT44(local_88._4_4_,(int)uVar15);
          }
          local_bc = 0;
LAB_001bb53e:
          task = local_c8;
          uVar21 = local_bc;
          if ((((ulong)local_88 & 1) == 0) && ((jpegd_debug & 0x40) != 0)) {
            _mpp_log_l(4,"jpegd_parser","bit read error!\n",(char *)0x0);
            uVar21 = local_bc;
          }
        }
LAB_001bb751:
        if (uVar21 == 0) {
          pJVar33->dht_found = '\x01';
          break;
        }
        pcVar16 = "huffman table decode error\n";
      }
      _mpp_log_l(2,"jpegd_parser",pcVar16,"jpegd_decode_frame");
      ctx = local_b8;
      goto LAB_001bbd7a;
    }
    pRVar10 = local_b8->bit_ctx->data_;
    if (pRVar22 <= pRVar10) goto LAB_001bb8cc;
    goto LAB_001ba1e2;
  }
LAB_001bbd7a:
  pBVar24 = (BitReadCtx_t *)0xfffffc14;
  pJVar30 = (JpegdCtx *)ctx;
  goto joined_r0x001bbbce;
LAB_001bb8cc:
  local_98 = (BitReadCtx_t *)0x0;
  pJVar19 = local_d0;
  ctx = local_b8;
LAB_001bb8dd:
  pJVar30 = (JpegdCtx *)ctx;
  if (pJVar19->dht_found == '\0') {
    if ((jpegd_debug & 2) != 0) {
      _mpp_log_l(4,"jpegd_parser","sorry, DHT is not found!\n",(char *)0x0);
    }
    if ((jpegd_debug & 1) != 0) {
      _mpp_log_l(4,"jpegd_parser","enter\n","jpegd_setup_default_dht");
    }
    pJVar30 = local_b8;
    pJVar18 = ((JpegdCtx *)ctx)->syntax;
    pRVar12 = pJVar18->ac_table[0].vals;
    lVar23 = 0;
    pAVar14 = pJVar18->ac_table;
    do {
      puVar1 = (&PTR_jpegd_setup_default_dht_bits_ac_luminance_002f03a0)[lVar23];
      puVar2 = (&PTR_jpegd_setup_default_dht_val_ac_luminance_002f03c0)[lVar23];
      lVar37 = 0;
      uVar21 = 0;
      do {
        bVar35 = puVar1[lVar37];
        pAVar14->bits[lVar37] = (uint)bVar35;
        uVar21 = uVar21 + bVar35;
        lVar37 = lVar37 + 1;
      } while (lVar37 != 0x10);
      pJVar18->ac_table[lVar23].actual_length = uVar21;
      if (uVar21 != 0) {
        uVar34 = 0;
        do {
          pRVar12[uVar34] = (uint)(byte)puVar2[uVar34];
          uVar34 = uVar34 + 1;
        } while (uVar21 != uVar34);
      }
      pAVar14 = pAVar14 + 1;
      pRVar12 = pRVar12 + 0xb3;
      bVar38 = lVar23 == 0;
      lVar23 = lVar23 + 1;
    } while (bVar38);
    pRVar12 = pJVar18->dc_table[0].vals;
    pDVar25 = pJVar18->dc_table;
    lVar23 = 0;
    do {
      puVar1 = (&PTR_jpegd_setup_default_dht_bits_dc_luminance_002f03b0)[lVar23];
      puVar2 = (&PTR_jpegd_setup_default_dht_val_dc_002f03d0)[lVar23];
      lVar37 = 0;
      uVar21 = 0;
      do {
        bVar35 = puVar1[lVar37];
        pDVar25->bits[lVar37] = (uint)bVar35;
        uVar21 = uVar21 + bVar35;
        lVar37 = lVar37 + 1;
      } while (lVar37 != 0x10);
      pJVar18->dc_table[lVar23].actual_length = uVar21;
      if (uVar21 != 0) {
        uVar34 = 0;
        do {
          pRVar12[uVar34] = (uint)(byte)puVar2[uVar34];
          uVar34 = uVar34 + 1;
        } while (uVar21 != uVar34);
      }
      pDVar25 = pDVar25 + 1;
      pRVar12 = pRVar12 + 0x1d;
      bVar38 = lVar23 == 0;
      lVar23 = lVar23 + 1;
    } while (bVar38);
    if ((jpegd_debug & 1) != 0) {
      _mpp_log_l(4,"jpegd_parser","exit\n","jpegd_setup_default_dht");
    }
    local_d0->htbl_entry = '\x0f';
    pJVar19 = local_d0;
    pRVar22 = local_b0;
  }
  if (pJVar19->sof0_found == '\0') {
    _mpp_log_l(2,"jpegd_parser","sof marker not found!\n","jpegd_decode_frame");
    local_98 = (BitReadCtx_t *)0xfffffc14;
  }
  pBVar24 = local_98;
  task = local_c8;
  if (pJVar19->eoi_found == '\0') {
    if (pRVar10 < pRVar22) {
      pRVar10 = (RK_U8 *)memchr(pRVar10,0xffd9,(ulong)(uint)((int)local_58 - (int)pRVar10));
      pBVar24 = local_98;
      task = local_c8;
      if (pRVar10 != (RK_U8 *)0x0 && pRVar10 < pRVar22) goto joined_r0x001bbbce;
    }
    else {
      _mpp_log_l(2,"jpegd_parser","buf ptr %p is overflow the buf end %p.",(char *)0x0,pRVar10,
                 pRVar22);
    }
    _mpp_log_l(2,"jpegd_parser","EOI marker not found!\n","jpegd_decode_frame");
    pBVar24 = (BitReadCtx_t *)0xfffffc14;
    task = local_c8;
  }
joined_r0x001bbbce:
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"jpegd_parser","exit\n","jpegd_decode_frame");
  }
  if ((int)pBVar24 == 0) {
    if ((jpegd_debug & 1) != 0) {
      _mpp_log_l(4,"jpegd_parser","enter\n","jpegd_allocate_frame");
    }
    pJVar18 = pJVar30->syntax;
    slots = pJVar30->frame_slots;
    s = pJVar30->output_frame;
    _out = pJVar30->frame_slot_index;
    if (_out == -1) {
      v = MPP_FMT_YUV420SP;
      if ((ulong)pJVar18->yuv_mode < 5) {
        v = *(MppFrameFormat *)(&DAT_0028f724 + (ulong)pJVar18->yuv_mode * 4);
      }
      local_98 = pBVar24;
      mpp_frame_set_fmt(s,v);
      mpp_frame_set_width(s,pJVar18->width);
      mpp_frame_set_height(s,pJVar18->height);
      mpp_frame_set_hor_stride(s,pJVar18->hor_stride);
      mpp_frame_set_ver_stride(s,pJVar18->ver_stride);
      mpp_frame_set_pts(s,pJVar30->pts);
      if (pJVar30->eos != 0) {
        mpp_frame_set_eos(s,1);
      }
      mpp_buf_slot_get_unused(slots,&_out);
      pJVar30->frame_slot_index = _out;
      if ((jpegd_debug & 0x20) != 0) {
        _mpp_log_l(4,"jpegd_parser","frame_slot_index:%d\n",(char *)0x0);
      }
      local_34 = 2;
      mpp_slots_set_prop(slots,SLOTS_NUMERATOR,&local_34);
      local_34 = 1;
      mpp_slots_set_prop(slots,SLOTS_DENOMINATOR,&local_34);
      MVar8 = mpp_buf_slot_set_prop(slots,_out,SLOT_FRAME,s);
      if (MVar8 != MPP_OK) {
        return MPP_ERR_VALUE;
      }
      mpp_buf_slot_set_flag(slots,_out,SLOT_CODEC_USE);
      mpp_buf_slot_set_flag(slots,_out,SLOT_HAL_OUTPUT);
      pBVar24 = local_98;
    }
    if ((jpegd_debug & 1) != 0) {
      _mpp_log_l(4,"jpegd_parser","exit\n","jpegd_allocate_frame");
    }
    (task->syntax).data = pJVar30->syntax;
    (task->syntax).number = 0x930;
    task->output = pJVar30->frame_slot_index;
    task->valid = 1;
    if ((jpegd_debug & 1) != 0) {
      _mpp_log_l(4,"jpegd_parser","enter\n","jpegd_update_frame");
    }
    mpp_buf_slot_clr_flag(pJVar30->frame_slots,pJVar30->frame_slot_index,SLOT_CODEC_USE);
    pJVar30->frame_slot_index = -1;
    if ((jpegd_debug & 1) != 0) {
      _mpp_log_l(4,"jpegd_parser","exit\n","jpegd_update_frame");
    }
  }
  else {
    *(byte *)&task->flags = *(byte *)&task->flags | 4;
  }
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"jpegd_parser","exit\n","jpegd_parse");
  }
  return (MPP_RET)pBVar24;
}

Assistant:

static MPP_RET jpegd_parse(void *ctx, HalDecTask *task)
{
    jpegd_dbg_func("enter\n");
    MPP_RET ret = MPP_OK;
    JpegdCtx *JpegCtx = (JpegdCtx *)ctx;
    task->valid = 0;

    JpegCtx->buffer = (RK_U8 *)mpp_packet_get_data(JpegCtx->input_packet);

    memset(JpegCtx->syntax, 0, sizeof(JpegdSyntax));

    ret = jpegd_decode_frame(JpegCtx);
    if (MPP_OK == ret) {
        if (jpegd_allocate_frame(JpegCtx))
            return MPP_ERR_VALUE;

        task->syntax.data = (void *)JpegCtx->syntax;
        task->syntax.number = sizeof(JpegdSyntax);
        task->output = JpegCtx->frame_slot_index;
        task->valid = 1;

        jpegd_update_frame(JpegCtx);
    } else
        task->flags.parse_err = 1;

    jpegd_dbg_func("exit\n");
    return ret;
}